

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_socket.c
# Opt level: O0

int pcp_socket_create_impl(int domain,int type,int protocol)

{
  uint16_t uVar1;
  int iVar2;
  pcp_errno pVar3;
  size_t sVar4;
  undefined4 local_bc;
  sockaddr_in **ppsStack_b8;
  int optval;
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  sockaddr_storage sas;
  unsigned_long iMode;
  uint32_t flg;
  int s;
  int protocol_local;
  int type_local;
  int domain_local;
  
  sas.__ss_align = 1;
  sin6 = (sockaddr_in6 *)&sin;
  ppsStack_b8 = &sin;
  flg = protocol;
  s = type;
  protocol_local = domain;
  memset(&sin,0,0x80);
  sin._0_2_ = (short)protocol_local;
  if (protocol_local == 2) {
    uVar1 = htons(0x14e6);
    sin6->sin6_port = uVar1;
  }
  else if (protocol_local == 10) {
    uVar1 = htons(0x14e6);
    *(uint16_t *)((long)ppsStack_b8 + 2) = uVar1;
  }
  else {
    pcp_logger(PCP_LOGLVL_ERR,"Unsupported socket domain:%d",(ulong)(uint)protocol_local);
  }
  iMode._4_4_ = socket(protocol_local,s,flg);
  if (iMode._4_4_ == -1) {
    type_local = -1;
  }
  else {
    iMode._0_4_ = fcntl(iMode._4_4_,3,0);
    iVar2 = fcntl(iMode._4_4_,4,(ulong)((uint)iMode | 0x800));
    if (iVar2 == 0) {
      iMode._0_4_ = 0;
      iVar2 = setsockopt(iMode._4_4_,0x29,0x1a,&iMode,4);
      if (iVar2 == -1) {
        pcp_logger(PCP_LOGLVL_ERR,"%s",
                   "Dual-stack sockets are not supported on this platform. Recompile library with disabled IPv6 support."
                  );
        close(iMode._4_4_);
        type_local = -1;
      }
      else {
        local_bc = 1;
        iVar2 = setsockopt(iMode._4_4_,0,8,&local_bc,4);
        if (iVar2 < 0) {
          pcp_logger(PCP_LOGLVL_ERR,"%s","Unable to set IP_PKTINFO option for socket.");
        }
        iVar2 = setsockopt(iMode._4_4_,0x29,0x31,&local_bc,4);
        if (iVar2 < 0) {
          pcp_logger(PCP_LOGLVL_ERR,"%s","Unable to set IPV6_RECVPKTINFO option for socket.");
          close(iMode._4_4_);
          type_local = -1;
        }
        else {
          while( true ) {
            iVar2 = iMode._4_4_;
            sVar4 = get_sa_len((sockaddr *)&sin);
            iVar2 = bind(iVar2,(sockaddr *)&sin,(socklen_t)sVar4);
            if (iVar2 != -1) break;
            pVar3 = pcp_get_error();
            if (pVar3 != PCP_ERR_ADDRINUSE) {
              pcp_logger(PCP_LOGLVL_ERR,"%s","bind error");
              close(iMode._4_4_);
              return -1;
            }
            if ((short)sin == 2) {
              uVar1 = ntohs(sin6->sin6_port);
              uVar1 = htons(uVar1 + 1);
              sin6->sin6_port = uVar1;
            }
            else {
              uVar1 = ntohs(*(uint16_t *)((long)ppsStack_b8 + 2));
              uVar1 = htons(uVar1 + 1);
              *(uint16_t *)((long)ppsStack_b8 + 2) = uVar1;
            }
          }
          type_local = iMode._4_4_;
        }
      }
    }
    else {
      pcp_logger(PCP_LOGLVL_ERR,"%s","Unable to set nonblocking mode for socket.");
      close(iMode._4_4_);
      type_local = -1;
    }
  }
  return type_local;
}

Assistant:

static PCP_SOCKET pcp_socket_create_impl(int domain, int type, int protocol) {
#ifdef PCP_SOCKET_IS_VOIDPTR
    return PCP_INVALID_SOCKET;
#else
    PCP_SOCKET s;
    uint32_t flg;
    unsigned long iMode = 1;
    struct sockaddr_storage sas;
    struct sockaddr_in *sin = (struct sockaddr_in *)&sas;
    struct sockaddr_in6 *sin6 = (struct sockaddr_in6 *)&sas;

    OSDEP(iMode);
    OSDEP(flg);

    memset(&sas, 0, sizeof(sas));
    sas.ss_family = domain;
    if (domain == AF_INET) {
        sin->sin_port = htons(5350);
        SET_SA_LEN(sin, sizeof(struct sockaddr_in));
    } else if (domain == AF_INET6) {
        sin6->sin6_port = htons(5350);
        SET_SA_LEN(sin6, sizeof(struct sockaddr_in6));
    } else {
        PCP_LOG(PCP_LOGLVL_ERR, "Unsupported socket domain:%d", domain);
    }

    s = (PCP_SOCKET)socket(domain, type, protocol);
    if (s == PCP_INVALID_SOCKET)
        return PCP_INVALID_SOCKET;

#ifdef WIN32
    if (ioctlsocket(s, FIONBIO, &iMode)) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Unable to set nonblocking mode for socket.");
        CLOSE(s);
        return PCP_INVALID_SOCKET;
    }
#else  // WIN32
    flg = fcntl(s, F_GETFL, 0);
    if (fcntl(s, F_SETFL, flg | O_NONBLOCK)) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Unable to set nonblocking mode for socket.");
        CLOSE(s);
        return PCP_INVALID_SOCKET;
    }
#endif //! WIN32
#ifdef PCP_USE_IPV6_SOCKET
    flg = 0;
    if (PCP_SOCKET_ERROR ==
        setsockopt(s, IPPROTO_IPV6, IPV6_V6ONLY, (char *)&flg, sizeof(flg))) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Dual-stack sockets are not supported on this platform. "
                "Recompile library with disabled IPv6 support.");
        CLOSE(s);
        return PCP_INVALID_SOCKET;
    }
#endif // PCP_USE_IPV6_SOCKET
#if defined(IP_PKTINFO) || defined(IPV6_RECVPKTINFO) || defined(IPV6_PKTINFO)
    {
        int optval = 1;
#if defined WIN32 && defined IPV6_PKTINFO
        if (setsockopt(s, IPPROTO_IPV6, IPV6_PKTINFO, (char *)&optval,
                       sizeof(optval)) < 0) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Unable to set IPV6_PKTINFO option for socket.");
            CLOSE(s);
            return PCP_INVALID_SOCKET;
        }
#endif // WIN32 && IPV6_PKTINFO
#ifdef IP_PKTINFO
        if (setsockopt(s, IPPROTO_IP, IP_PKTINFO, (char *)&optval,
                       sizeof(optval)) < 0) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Unable to set IP_PKTINFO option for socket.");
        }
#endif // IP_PKTINFO
#ifdef IPV6_RECVPKTINFO
        if (setsockopt(s, IPPROTO_IPV6, IPV6_RECVPKTINFO, (char *)&optval,
                       sizeof(optval)) < 0) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Unable to set IPV6_RECVPKTINFO option for socket.");
            CLOSE(s);
            return PCP_INVALID_SOCKET;
        }
#endif // IPV6_RECVPKTINFO
    }
#endif // IP_PKTINFO && IPV6_RECVPKTINFO
    while (bind(s, (struct sockaddr *)&sas, SA_LEN((struct sockaddr *)&sas)) ==
           PCP_SOCKET_ERROR) {
        if (pcp_get_error() == PCP_ERR_ADDRINUSE) {
            if (sas.ss_family == AF_INET) {
                sin->sin_port = htons(ntohs(sin->sin_port) + 1);
            } else {
                sin6->sin6_port = htons(ntohs(sin6->sin6_port) + 1);
            }
        } else {
            PCP_LOG(PCP_LOGLVL_ERR, "%s", "bind error");
            CLOSE(s);
            return PCP_INVALID_SOCKET;
        }
    }
    PCP_LOG(PCP_LOGLVL_DEBUG, "%s: return %d", __FUNCTION__, s);
    return s;
#endif
}